

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O0

void __thiscall
AbstractTxIn_ConstractorGetterSetter_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,AbstractTxIn *actual)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_2a0;
  Message local_298;
  Script local_290;
  Script local_258;
  string local_220;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_5;
  Message local_1e8;
  uint32_t local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_4;
  Message local_1c0;
  OutPoint local_1b8;
  uint32_t local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_3;
  Message local_170;
  OutPoint local_168;
  Txid local_140;
  string local_120;
  string local_100;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  uint32_t local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  Message local_a0 [3];
  Txid local_88;
  string local_68;
  string local_48;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  AbstractTxIn *actual_local;
  anon_class_1_0_00000001 *this_local;
  
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)actual;
  cfd::core::Txid::GetHex_abi_cxx11_(&local_48,&expect_txid);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTxIn::GetTxid(&local_88,actual);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_68,&local_88);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_28,"expect_txid.GetHex().c_str()","actual.GetTxid().GetHex().c_str()"
             ,pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_68);
  cfd::core::Txid::~Txid(&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_bc = cfd::core::AbstractTxIn::GetVout(actual);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_b8,"expect_index","actual.GetVout()",&expect_index,&local_bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_100,&expect_txid);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTxIn::GetOutPoint(&local_168,actual);
  cfd::core::OutPoint::GetTxid(&local_140,&local_168);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_120,&local_140);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_e0,"expect_txid.GetHex().c_str()",
             "actual.GetOutPoint().GetTxid().GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_120);
  cfd::core::Txid::~Txid(&local_140);
  cfd::core::OutPoint::~OutPoint(&local_168);
  std::__cxx11::string::~string((string *)&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  cfd::core::AbstractTxIn::GetOutPoint(&local_1b8,actual);
  local_18c = cfd::core::OutPoint::GetVout(&local_1b8);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_188,"expect_index","actual.GetOutPoint().GetVout()",
             &expect_index,&local_18c);
  cfd::core::OutPoint::~OutPoint(&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1dc = cfd::core::AbstractTxIn::GetSequence(actual);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_1d8,"expect_sequence","actual.GetSequence()",&expect_sequence,
             &local_1dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTxIn::GetUnlockingScript(&local_290,actual);
  cfd::core::Script::GetScript(&local_258,&local_290);
  cfd::core::Script::GetHex_abi_cxx11_(&local_220,&local_258);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_200,"expect_script_hex.c_str()",
             "actual.GetUnlockingScript().GetScript().GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_220);
  cfd::core::Script::~Script(&local_258);
  cfd::core::Script::~Script(&local_290);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  return;
}

Assistant:

TEST(AbstractTxIn, ConstractorGetterSetter) {
  const auto check = [](AbstractTxIn actual) -> void {
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetVout());
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetOutPoint().GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetOutPoint().GetVout());
    EXPECT_EQ(expect_sequence, actual.GetSequence());
    EXPECT_STREQ(expect_script_hex.c_str(),
        actual.GetUnlockingScript().GetScript().GetHex().c_str());
  };

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence,
                                       expect_unlocking_script);
    check(actual);
  }

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence);
    actual.SetUnlockingScript(expect_unlocking_script);
    check(actual);
  }
}